

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O1

void __thiscall Json::JsonArray::__toList(JsonArray *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  value_type *pvVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  value_type *__x;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ulong local_40;
  pointer local_38;
  
  this_00 = &this->__lstJsonText;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_00,(this->__lstJsonText).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_60)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  psVar4 = (this->__lstJsonArray).
           super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->__lstJsonArray).
             super__Vector_base<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (long)local_38 - (long)psVar4;
  if (local_40 != 0) {
    local_40 = local_40 >> 4;
    iVar5 = 0;
    do {
      peVar1 = (psVar4->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (psVar4->super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      iVar3 = (*peVar1->_vptr_JsonValue[10])();
      pvVar2 = (value_type *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
      for (__x = *(value_type **)CONCAT44(extraout_var,iVar3); __x != pvVar2; __x = __x + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,__x);
      }
      iVar5 = iVar5 + 1;
      if (iVar5 < (int)local_40) {
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != local_38);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,'\x01');
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&local_60)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Json::JsonArray::__toList() {
    __lstJsonText.clear();
    __lstJsonText.push_back(_JSCS(JSON_ARRAY_BEGIN));
    int __index = 0, __size = __lstJsonArray.size();
    for (std::shared_ptr<JsonValue> jsonValue : __lstJsonArray) {
        for (auto &&p : jsonValue->toList()) __lstJsonText.push_back(p);
        __index++;
        if (__index < __size) __lstJsonText.push_back(_JSCS(JSON_SEPARATE));
    }
    __lstJsonText.push_back(_JSCS(JSON_ARRAY_END));
}